

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

string * __thiscall
pbrt::PBRTOptions::ToString_abi_cxx11_(string *__return_storage_ptr__,PBRTOptions *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<int_const&,int_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
            (__return_storage_ptr__,
             "[ PBRTOptions nThreads: %d seed: %d quickRender: %s quiet: %s recordPixelStatistics: %s upgrade: %s disablePixelJitter: %s disableWavelengthJitter: %s forceDiffuse: %s useGPU: %s imageFile: %s mseReferenceImage: %s mseReferenceOutput: %s debugStart: %s displayServer: %s cropWindow: %s pixelBounds: %s ]"
             ,&this->nThreads,(int *)this,&this->quickRender,&(this->super_BasicPBRTOptions).quiet,
             &this->recordPixelStatistics,&this->upgrade,
             &(this->super_BasicPBRTOptions).disablePixelJitter,
             &(this->super_BasicPBRTOptions).disableWavelengthJitter,
             &(this->super_BasicPBRTOptions).forceDiffuse,&(this->super_BasicPBRTOptions).useGPU,
             &this->imageFile,&this->mseReferenceImage,&this->mseReferenceOutput,&this->debugStart,
             &this->displayServer,&this->cropWindow,&this->pixelBounds);
  return __return_storage_ptr__;
}

Assistant:

std::string PBRTOptions::ToString() const {
    return StringPrintf(
        "[ PBRTOptions nThreads: %d seed: %d quickRender: %s quiet: %s "
        "recordPixelStatistics: %s upgrade: %s disablePixelJitter: %s "
        "disableWavelengthJitter: %s forceDiffuse: %s useGPU: %s "
        "imageFile: %s mseReferenceImage: %s mseReferenceOutput: %s "
        "debugStart: %s displayServer: %s cropWindow: %s pixelBounds: %s ]",
        nThreads, seed, quickRender, quiet, recordPixelStatistics, upgrade,
        disablePixelJitter, disableWavelengthJitter, forceDiffuse, useGPU, imageFile,
        mseReferenceImage, mseReferenceOutput, debugStart, displayServer, cropWindow,
        pixelBounds);
}